

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  size_type sVar2;
  float *pfVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar4;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob1_7;
  size_t b_3;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_6;
  int i_5;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  float coeff;
  Mat *bottom_blob1_5;
  size_t b_2;
  int i_4;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  float coeff1;
  float coeff0;
  Mat *bottom_blob1_4;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob1_3;
  size_t b_1;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_2;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob1_1;
  size_t b;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *m_18;
  Mat *m_16;
  Mat *m_15;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_19;
  Mat *m_17;
  Mat *m_14;
  Mat *m_12;
  Mat *m_9;
  Mat *m_7;
  Mat *m_4;
  Mat *m_2;
  Allocator *in_stack_ffffffffffffe560;
  Mat *in_stack_ffffffffffffe568;
  Mat *in_stack_ffffffffffffe570;
  int local_1764;
  undefined8 local_1760;
  undefined8 local_1758;
  undefined8 local_1750;
  undefined4 local_1748;
  Allocator *local_1740;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  undefined8 local_1720;
  void *local_1718;
  undefined8 local_1710;
  undefined8 local_1708;
  undefined8 local_1700;
  undefined4 local_16f8;
  Allocator *local_16f0;
  undefined4 local_16e8;
  undefined4 local_16e4;
  undefined4 local_16e0;
  undefined4 local_16dc;
  undefined4 local_16d8;
  undefined8 local_16d0;
  void *local_16c8;
  int local_16bc;
  const_reference local_16b8;
  ulong local_16b0;
  int local_16a4;
  undefined8 local_16a0;
  undefined8 local_1698;
  undefined8 local_1690;
  undefined4 local_1688;
  Allocator *local_1680;
  undefined4 local_1678;
  undefined4 local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined4 local_1668;
  undefined8 local_1660;
  void *local_1658;
  undefined8 local_1650;
  undefined8 local_1648;
  undefined8 local_1640;
  undefined4 local_1638;
  Allocator *local_1630;
  undefined4 local_1628;
  undefined4 local_1624;
  undefined4 local_1620;
  undefined4 local_161c;
  undefined4 local_1618;
  undefined8 local_1610;
  void *local_1608;
  undefined8 local_1600;
  undefined8 local_15f8;
  undefined8 local_15f0;
  undefined4 local_15e8;
  Allocator *local_15e0;
  undefined4 local_15d8;
  undefined4 local_15d4;
  undefined4 local_15d0;
  undefined4 local_15cc;
  undefined4 local_15c8;
  undefined8 local_15c0;
  void *local_15b8;
  int local_15ac;
  const_reference local_15a8;
  int local_159c;
  undefined8 local_1598;
  undefined8 local_1590;
  undefined8 local_1588;
  undefined4 local_1580;
  Allocator *local_1578;
  undefined4 local_1570;
  undefined4 local_156c;
  undefined4 local_1568;
  undefined4 local_1564;
  undefined4 local_1560;
  undefined8 local_1558;
  void *local_1550;
  undefined8 local_1548;
  undefined8 local_1540;
  undefined8 local_1538;
  undefined4 local_1530;
  Allocator *local_1528;
  undefined4 local_1520;
  undefined4 local_151c;
  undefined4 local_1518;
  undefined4 local_1514;
  undefined4 local_1510;
  undefined8 local_1508;
  void *local_1500;
  int local_14f8;
  float local_14f4;
  const_reference local_14f0;
  ulong local_14e8;
  int local_14dc;
  undefined8 local_14d8;
  undefined8 local_14d0;
  undefined8 local_14c8;
  undefined4 local_14c0;
  Allocator *local_14b8;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  undefined4 local_14a0;
  undefined8 local_1498;
  void *local_1490;
  undefined8 local_1488;
  undefined8 local_1480;
  undefined8 local_1478;
  undefined4 local_1470;
  Allocator *local_1468;
  undefined4 local_1460;
  undefined4 local_145c;
  undefined4 local_1458;
  undefined4 local_1454;
  undefined4 local_1450;
  undefined8 local_1448;
  void *local_1440;
  undefined8 local_1438;
  undefined8 local_1430;
  undefined8 local_1428;
  undefined4 local_1420;
  Allocator *local_1418;
  undefined4 local_1410;
  undefined4 local_140c;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined8 local_13f8;
  void *local_13f0;
  int local_13e4;
  float local_13e0;
  float local_13dc;
  const_reference local_13d8;
  int local_13cc;
  undefined8 local_13c8;
  undefined8 local_13c0;
  undefined8 local_13b8;
  undefined4 local_13b0;
  Allocator *local_13a8;
  undefined4 local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined4 local_1390;
  undefined8 local_1388;
  void *local_1380;
  undefined8 local_1378;
  undefined8 local_1370;
  undefined8 local_1368;
  undefined4 local_1360;
  Allocator *local_1358;
  undefined4 local_1350;
  undefined4 local_134c;
  undefined4 local_1348;
  undefined4 local_1344;
  undefined4 local_1340;
  undefined8 local_1338;
  void *local_1330;
  int local_1324;
  const_reference local_1320;
  ulong local_1318;
  int local_130c;
  undefined8 local_1308;
  undefined8 local_1300;
  undefined8 local_12f8;
  undefined4 local_12f0;
  Allocator *local_12e8;
  undefined4 local_12e0;
  undefined4 local_12dc;
  undefined4 local_12d8;
  undefined4 local_12d4;
  undefined4 local_12d0;
  undefined8 local_12c8;
  void *local_12c0;
  undefined8 local_12b8;
  undefined8 local_12b0;
  undefined8 local_12a8;
  undefined4 local_12a0;
  Allocator *local_1298;
  undefined4 local_1290;
  undefined4 local_128c;
  undefined4 local_1288;
  undefined4 local_1284;
  undefined4 local_1280;
  undefined8 local_1278;
  void *local_1270;
  undefined8 local_1268;
  undefined8 local_1260;
  undefined8 local_1258;
  undefined4 local_1250;
  Allocator *local_1248;
  undefined4 local_1240;
  undefined4 local_123c;
  undefined4 local_1238;
  undefined4 local_1234;
  undefined4 local_1230;
  undefined8 local_1228;
  void *local_1220;
  int local_1214;
  const_reference local_1210;
  int local_1204;
  undefined8 local_1200;
  undefined8 local_11f8;
  undefined8 local_11f0;
  undefined4 local_11e8;
  Allocator *local_11e0;
  undefined4 local_11d8;
  undefined4 local_11d4;
  undefined4 local_11d0;
  undefined4 local_11cc;
  undefined4 local_11c8;
  undefined8 local_11c0;
  void *local_11b8;
  undefined8 local_11b0;
  undefined8 local_11a8;
  undefined8 local_11a0;
  undefined4 local_1198;
  Allocator *local_1190;
  undefined4 local_1188;
  undefined4 local_1184;
  undefined4 local_1180;
  undefined4 local_117c;
  undefined4 local_1178;
  undefined8 local_1170;
  void *local_1168;
  int local_115c;
  const_reference local_1158;
  ulong local_1150;
  int local_1144;
  undefined8 local_1140;
  undefined8 local_1138;
  undefined8 local_1130;
  undefined4 local_1128;
  Allocator *local_1120;
  undefined4 local_1118;
  undefined4 local_1114;
  undefined4 local_1110;
  undefined4 local_110c;
  undefined4 local_1108;
  undefined8 local_1100;
  void *local_10f8;
  undefined8 local_10f0;
  undefined8 local_10e8;
  undefined8 local_10e0;
  undefined4 local_10d8;
  Allocator *local_10d0;
  undefined4 local_10c8;
  undefined4 local_10c4;
  undefined4 local_10c0;
  undefined4 local_10bc;
  undefined4 local_10b8;
  undefined8 local_10b0;
  void *local_10a8;
  undefined8 local_1090;
  undefined8 local_1088;
  undefined8 local_1080;
  undefined4 local_1078;
  Allocator *local_1070;
  undefined4 local_1068;
  undefined4 local_1064;
  undefined4 local_1060;
  undefined4 local_105c;
  undefined4 local_1058;
  undefined8 local_1050;
  void *local_1048;
  int local_103c;
  const_reference local_1038;
  reference local_1030;
  int local_1024;
  int local_1020;
  int local_101c;
  int local_1018;
  int local_1014;
  const_reference local_1010;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1000;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_ff8;
  int local_fe4;
  undefined8 *local_fe0;
  undefined8 *local_fd0;
  undefined8 *local_fc0;
  undefined8 *local_fb0;
  undefined8 *local_fa0;
  undefined8 *local_f90;
  undefined8 *local_f80;
  undefined8 *local_f70;
  undefined8 *local_f60;
  undefined8 *local_f50;
  undefined8 *local_f40;
  undefined8 *local_f30;
  undefined8 *local_f20;
  undefined8 *local_f10;
  undefined8 *local_f00;
  undefined8 *local_ef0;
  undefined8 *local_ee0;
  undefined8 *local_ed0;
  undefined8 *local_ec0;
  undefined8 *local_eb0;
  reference local_ea0;
  undefined1 local_e95;
  int local_e94;
  const_reference local_e90;
  undefined8 *local_e88;
  undefined1 local_e75;
  int local_e74;
  const_reference local_e70;
  undefined8 *local_e68;
  undefined1 local_e55;
  int local_e54;
  const_reference local_e50;
  undefined8 *local_e48;
  undefined1 local_e35;
  int local_e34;
  const_reference local_e30;
  undefined8 *local_e28;
  undefined1 local_e15;
  int local_e14;
  const_reference local_e10;
  undefined8 *local_e08;
  undefined1 local_df5;
  int local_df4;
  const_reference local_df0;
  undefined8 *local_de8;
  undefined1 local_dd5;
  int local_dd4;
  const_reference local_dd0;
  undefined8 *local_dc8;
  undefined1 local_db5;
  int local_db4;
  const_reference local_db0;
  undefined8 *local_da8;
  undefined1 local_d95;
  int local_d94;
  const_reference local_d90;
  undefined8 *local_d88;
  undefined1 local_d75;
  int local_d74;
  const_reference local_d70;
  undefined8 *local_d68;
  undefined1 local_d55;
  int local_d54;
  const_reference local_d50;
  undefined8 *local_d48;
  undefined1 local_d35;
  int local_d34;
  const_reference local_d30;
  undefined8 *local_d28;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  undefined8 *local_cf8;
  undefined8 *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined8 *local_cc8;
  undefined8 *local_cc0;
  undefined1 local_cb5;
  int local_cb4;
  reference local_cb0;
  undefined8 *local_ca8;
  undefined1 local_c95;
  int local_c94;
  reference local_c90;
  undefined8 *local_c88;
  undefined1 local_c75;
  int local_c74;
  reference local_c70;
  undefined8 *local_c68;
  undefined1 local_c55;
  int local_c54;
  reference local_c50;
  undefined8 *local_c48;
  undefined1 local_c35;
  int local_c34;
  reference local_c30;
  undefined8 *local_c28;
  undefined1 local_c15;
  int local_c14;
  reference local_c10;
  undefined8 *local_c08;
  undefined1 local_bf5;
  int local_bf4;
  reference local_bf0;
  undefined8 *local_be8;
  undefined1 local_bd5;
  int local_bd4;
  reference local_bd0;
  undefined8 *local_bc8;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined8 *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  undefined8 *local_b88;
  undefined8 *local_b80;
  size_type local_b78;
  long *local_b70;
  undefined8 local_b68;
  long *local_b60;
  undefined8 local_b58;
  undefined8 *local_b50;
  undefined8 *local_9f0;
  undefined8 *local_9d0;
  undefined8 *local_9b0;
  undefined8 *local_990;
  undefined8 *local_970;
  undefined8 *local_950;
  undefined8 *local_930;
  undefined8 *local_910;
  undefined8 *local_8f0;
  undefined8 *local_8d0;
  undefined8 *local_8b0;
  undefined8 *local_890;
  undefined8 *local_870;
  undefined8 *local_850;
  undefined8 *local_830;
  undefined8 *local_810;
  undefined8 *local_7f0;
  undefined8 *local_7d0;
  undefined8 *local_7b0;
  undefined8 *local_790;
  reference local_5a8;
  Allocator *local_5a0;
  int local_594;
  size_t local_590;
  void *local_588;
  int local_57c;
  int local_578;
  int local_574;
  undefined8 *local_570;
  Allocator *local_568;
  int local_55c;
  size_t local_558;
  void *local_550;
  int local_544;
  int local_540;
  int local_53c;
  undefined8 *local_538;
  Allocator *local_530;
  int local_524;
  size_t local_520;
  void *local_518;
  int local_50c;
  int local_508;
  int local_504;
  undefined8 *local_500;
  Allocator *local_4f8;
  int local_4ec;
  size_t local_4e8;
  void *local_4e0;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  undefined8 *local_4c8;
  Allocator *local_4c0;
  int local_4b4;
  size_t local_4b0;
  void *local_4a8;
  int local_49c;
  int local_498;
  int local_494;
  undefined8 *local_490;
  Allocator *local_488;
  int local_47c;
  size_t local_478;
  void *local_470;
  int local_464;
  int local_460;
  int local_45c;
  undefined8 *local_458;
  Allocator *local_450;
  int local_444;
  size_t local_440;
  void *local_438;
  int local_42c;
  int local_428;
  int local_424;
  undefined8 *local_420;
  Allocator *local_418;
  int local_40c;
  size_t local_408;
  void *local_400;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  undefined8 *local_3e8;
  Allocator *local_3e0;
  int local_3d4;
  size_t local_3d0;
  void *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  undefined8 *local_3b0;
  Allocator *local_3a8;
  int local_39c;
  size_t local_398;
  void *local_390;
  int local_384;
  int local_380;
  int local_37c;
  undefined8 *local_378;
  Allocator *local_370;
  int local_364;
  size_t local_360;
  void *local_358;
  int local_34c;
  int local_348;
  int local_344;
  undefined8 *local_340;
  Allocator *local_338;
  int local_32c;
  size_t local_328;
  void *local_320;
  int local_314;
  int local_310;
  int local_30c;
  undefined8 *local_308;
  Allocator *local_300;
  int local_2f4;
  size_t local_2f0;
  void *local_2e8;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  undefined8 *local_2d0;
  Allocator *local_2c8;
  int local_2bc;
  size_t local_2b8;
  void *local_2b0;
  int local_2a4;
  int local_2a0;
  int local_29c;
  undefined8 *local_298;
  Allocator *local_290;
  int local_284;
  size_t local_280;
  void *local_278;
  int local_26c;
  int local_268;
  int local_264;
  undefined8 *local_260;
  Allocator *local_258;
  int local_24c;
  size_t local_248;
  void *local_240;
  int local_234;
  int local_230;
  int local_22c;
  undefined8 *local_228;
  Allocator *local_220;
  int local_214;
  size_t local_210;
  void *local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  Allocator *local_1e8;
  int local_1dc;
  size_t local_1d8;
  void *local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  Allocator *local_1b0;
  int local_1a4;
  size_t local_1a0;
  void *local_198;
  int local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  Allocator *local_178;
  int local_16c;
  size_t local_168;
  void *local_160;
  int local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  undefined4 local_13c;
  long local_138;
  undefined4 local_12c;
  long local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_1000 = in_RDX;
  local_ff8 = in_RSI;
  local_1010 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1014 = local_1010->w;
  local_1018 = local_1010->h;
  local_101c = local_1010->d;
  local_1020 = local_1010->c;
  local_1024 = local_1014 * local_1018 * local_101c;
  local_1030 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1000,0);
  Mat::create_like(in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,in_stack_ffffffffffffe560);
  local_ea0 = local_1030;
  bVar4 = true;
  if (local_1030->data != (void *)0x0) {
    local_5a8 = local_1030;
    bVar4 = local_1030->cstep * (long)local_1030->c == 0;
  }
  if (bVar4) {
    local_fe4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xd0) == 0) {
      local_1038 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_ff8,1);
      for (local_103c = 0; local_103c < local_1020; local_103c = local_103c + 1) {
        local_d28 = &local_1090;
        local_3b4 = local_1010->w;
        local_3b8 = local_1010->h;
        local_3bc = local_1010->d;
        local_1048 = (void *)((long)local_1010->data +
                             local_1010->cstep * (long)local_103c * local_1010->elemsize);
        local_3d0 = local_1010->elemsize;
        local_3d4 = local_1010->elempack;
        local_3e0 = local_1010->allocator;
        local_3b0 = &local_1090;
        local_88 = (long)local_3b4 * (long)local_3b8 * local_3d0;
        local_cc0 = &local_1090;
        local_fe0 = &local_1090;
        local_8c = 0x10;
        local_d30 = local_1010;
        local_d34 = local_103c;
        local_d35 = 1;
        local_1090 = 0;
        local_1080 = 0;
        local_1078 = 0;
        local_1064 = 0;
        local_1060 = 0;
        local_105c = 0;
        local_1058 = 0;
        local_1088 = 0;
        local_d48 = &local_10f0;
        local_37c = local_1038->w;
        local_380 = local_1038->h;
        local_384 = local_1038->d;
        local_10a8 = (void *)((long)local_1038->data +
                             local_1038->cstep * (long)local_103c * local_1038->elemsize);
        local_398 = local_1038->elemsize;
        local_39c = local_1038->elempack;
        local_3a8 = local_1038->allocator;
        local_378 = &local_10f0;
        local_98 = (long)local_37c * (long)local_380 * local_398;
        local_9c = 0x10;
        local_d54 = local_103c;
        local_d55 = 1;
        local_1050 = 0;
        local_1068 = 0;
        local_cc8 = &local_10f0;
        local_fd0 = &local_10f0;
        local_bc8 = &local_1140;
        local_574 = local_1030->w;
        local_578 = local_1030->h;
        local_57c = local_1030->d;
        local_10f8 = (void *)((long)local_1030->data +
                             local_1030->cstep * (long)local_103c * local_1030->elemsize);
        local_590 = local_1030->elemsize;
        local_594 = local_1030->elempack;
        local_5a0 = local_1030->allocator;
        local_570 = &local_1140;
        local_8 = (long)local_574 * (long)local_578 * local_590;
        local_10b8 = 0;
        local_10bc = 0;
        local_10c0 = 0;
        local_10c4 = 0;
        local_10d8 = 0;
        local_10e0 = 0;
        local_10e8 = 0;
        local_10f0 = 0;
        local_c = 0x10;
        local_bd0 = local_1030;
        local_bd4 = local_103c;
        local_bd5 = 1;
        local_10b0 = 0;
        local_10c8 = 0;
        local_b80 = &local_1140;
        local_fc0 = &local_1140;
        local_1140 = 0;
        local_1130 = 0;
        local_1128 = 0;
        local_1118 = 0;
        local_1114 = 0;
        local_1110 = 0;
        local_110c = 0;
        local_1108 = 0;
        local_1100 = 0;
        local_1138 = 0;
        for (local_1144 = 0; local_1144 < local_1024; local_1144 = local_1144 + 1) {
          *(float *)((long)local_10f8 + (long)local_1144 * 4) =
               *(float *)((long)local_1048 + (long)local_1144 * 4) *
               *(float *)((long)local_10a8 + (long)local_1144 * 4);
        }
        local_d50 = local_1038;
        local_7d0 = local_fc0;
        local_7b0 = local_fd0;
        local_790 = local_fe0;
        local_588 = local_10f8;
        local_3c8 = local_1048;
        local_390 = local_10a8;
        local_1120 = local_5a0;
        local_10d0 = local_3a8;
        local_1070 = local_3e0;
      }
      for (local_1150 = 2; uVar1 = local_1150,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_ff8), uVar1 < sVar2
          ; local_1150 = local_1150 + 1) {
        local_1158 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_ff8,local_1150);
        for (local_115c = 0; local_115c < local_1020; local_115c = local_115c + 1) {
          local_d68 = &local_11b0;
          local_344 = local_1158->w;
          local_348 = local_1158->h;
          local_34c = local_1158->d;
          local_1168 = (void *)((long)local_1158->data +
                               local_1158->cstep * (long)local_115c * local_1158->elemsize);
          local_360 = local_1158->elemsize;
          local_364 = local_1158->elempack;
          local_370 = local_1158->allocator;
          local_340 = &local_11b0;
          local_a8 = (long)local_344 * (long)local_348 * local_360;
          local_cd0 = &local_11b0;
          local_fb0 = &local_11b0;
          local_ac = 0x10;
          local_d74 = local_115c;
          local_d75 = 1;
          local_11b0 = 0;
          local_11a0 = 0;
          local_1198 = 0;
          local_1184 = 0;
          local_1180 = 0;
          local_117c = 0;
          local_1178 = 0;
          local_11a8 = 0;
          local_be8 = &local_1200;
          local_53c = local_1030->w;
          local_540 = local_1030->h;
          local_544 = local_1030->d;
          local_11b8 = (void *)((long)local_1030->data +
                               local_1030->cstep * (long)local_115c * local_1030->elemsize);
          local_558 = local_1030->elemsize;
          local_55c = local_1030->elempack;
          local_568 = local_1030->allocator;
          local_538 = &local_1200;
          local_18 = (long)local_53c * (long)local_540 * local_558;
          local_1c = 0x10;
          local_bf0 = local_1030;
          local_bf4 = local_115c;
          local_bf5 = 1;
          local_1170 = 0;
          local_1188 = 0;
          local_b88 = &local_1200;
          local_fa0 = &local_1200;
          local_1200 = 0;
          local_11f0 = 0;
          local_11e8 = 0;
          local_11d8 = 0;
          local_11d4 = 0;
          local_11d0 = 0;
          local_11cc = 0;
          local_11c8 = 0;
          local_11c0 = 0;
          local_11f8 = 0;
          for (local_1204 = 0; local_1204 < local_1024; local_1204 = local_1204 + 1) {
            *(float *)((long)local_11b8 + (long)local_1204 * 4) =
                 *(float *)((long)local_1168 + (long)local_1204 * 4) *
                 *(float *)((long)local_11b8 + (long)local_1204 * 4);
          }
          local_d70 = local_1158;
          local_810 = local_fa0;
          local_7f0 = local_fb0;
          local_550 = local_11b8;
          local_358 = local_1168;
          local_11e0 = local_568;
          local_1190 = local_370;
        }
      }
    }
    else if (*(int *)(in_RDI + 0xd0) == 1) {
      if (*(int *)(in_RDI + 0x104) == 0) {
        local_1210 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_ff8,1);
        for (local_1214 = 0; local_1214 < local_1020; local_1214 = local_1214 + 1) {
          local_d88 = &local_1268;
          local_30c = local_1010->w;
          local_310 = local_1010->h;
          local_314 = local_1010->d;
          local_1220 = (void *)((long)local_1010->data +
                               local_1010->cstep * (long)local_1214 * local_1010->elemsize);
          local_328 = local_1010->elemsize;
          local_32c = local_1010->elempack;
          local_338 = local_1010->allocator;
          local_308 = &local_1268;
          local_b8 = (long)local_30c * (long)local_310 * local_328;
          local_cd8 = &local_1268;
          local_f90 = &local_1268;
          local_da8 = &local_12b8;
          local_2d4 = local_1210->w;
          local_2d8 = local_1210->h;
          local_2dc = local_1210->d;
          local_1270 = (void *)((long)local_1210->data +
                               local_1210->cstep * (long)local_1214 * local_1210->elemsize);
          local_2f0 = local_1210->elemsize;
          local_2f4 = local_1210->elempack;
          local_300 = local_1210->allocator;
          local_2d0 = &local_12b8;
          local_c8 = (long)local_2d4 * (long)local_2d8 * local_2f0;
          local_ce0 = &local_12b8;
          local_f80 = &local_12b8;
          local_1230 = 0;
          local_1234 = 0;
          local_1238 = 0;
          local_123c = 0;
          local_1250 = 0;
          local_1258 = 0;
          local_1260 = 0;
          local_1268 = 0;
          local_bc = 0x10;
          local_cc = 0x10;
          local_d90 = local_1010;
          local_d94 = local_1214;
          local_d95 = 1;
          local_db4 = local_1214;
          local_db5 = 1;
          local_1228 = 0;
          local_1240 = 0;
          local_12b8 = 0;
          local_12a8 = 0;
          local_12a0 = 0;
          local_128c = 0;
          local_1288 = 0;
          local_1284 = 0;
          local_1280 = 0;
          local_12b0 = 0;
          local_c08 = &local_1308;
          local_504 = local_1030->w;
          local_508 = local_1030->h;
          local_50c = local_1030->d;
          local_12c0 = (void *)((long)local_1030->data +
                               local_1030->cstep * (long)local_1214 * local_1030->elemsize);
          local_520 = local_1030->elemsize;
          local_524 = local_1030->elempack;
          local_530 = local_1030->allocator;
          local_500 = &local_1308;
          local_28 = (long)local_504 * (long)local_508 * local_520;
          local_2c = 0x10;
          local_c10 = local_1030;
          local_c14 = local_1214;
          local_c15 = 1;
          local_1278 = 0;
          local_1290 = 0;
          local_b90 = &local_1308;
          local_f70 = &local_1308;
          local_1308 = 0;
          local_12f8 = 0;
          local_12f0 = 0;
          local_12e0 = 0;
          local_12dc = 0;
          local_12d8 = 0;
          local_12d4 = 0;
          local_12d0 = 0;
          local_12c8 = 0;
          local_1300 = 0;
          for (local_130c = 0; local_130c < local_1024; local_130c = local_130c + 1) {
            *(float *)((long)local_12c0 + (long)local_130c * 4) =
                 *(float *)((long)local_1220 + (long)local_130c * 4) +
                 *(float *)((long)local_1270 + (long)local_130c * 4);
          }
          local_db0 = local_1210;
          local_870 = local_f70;
          local_850 = local_f80;
          local_830 = local_f90;
          local_518 = local_12c0;
          local_320 = local_1220;
          local_2e8 = local_1270;
          local_12e8 = local_530;
          local_1298 = local_300;
          local_1248 = local_338;
        }
        for (local_1318 = 2; uVar1 = local_1318,
            sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_ff8),
            uVar1 < sVar2; local_1318 = local_1318 + 1) {
          local_1320 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_ff8,local_1318);
          for (local_1324 = 0; local_1324 < local_1020; local_1324 = local_1324 + 1) {
            local_dc8 = &local_1378;
            local_29c = local_1320->w;
            local_2a0 = local_1320->h;
            local_2a4 = local_1320->d;
            local_1330 = (void *)((long)local_1320->data +
                                 local_1320->cstep * (long)local_1324 * local_1320->elemsize);
            local_2b8 = local_1320->elemsize;
            local_2bc = local_1320->elempack;
            local_2c8 = local_1320->allocator;
            local_298 = &local_1378;
            local_d8 = (long)local_29c * (long)local_2a0 * local_2b8;
            local_ce8 = &local_1378;
            local_f60 = &local_1378;
            local_dc = 0x10;
            local_dd4 = local_1324;
            local_dd5 = 1;
            local_1378 = 0;
            local_1368 = 0;
            local_1360 = 0;
            local_134c = 0;
            local_1348 = 0;
            local_1344 = 0;
            local_1340 = 0;
            local_1370 = 0;
            local_c28 = &local_13c8;
            local_4cc = local_1030->w;
            local_4d0 = local_1030->h;
            local_4d4 = local_1030->d;
            local_1380 = (void *)((long)local_1030->data +
                                 local_1030->cstep * (long)local_1324 * local_1030->elemsize);
            local_4e8 = local_1030->elemsize;
            local_4ec = local_1030->elempack;
            local_4f8 = local_1030->allocator;
            local_4c8 = &local_13c8;
            local_38 = (long)local_4cc * (long)local_4d0 * local_4e8;
            local_3c = 0x10;
            local_c30 = local_1030;
            local_c34 = local_1324;
            local_c35 = 1;
            local_1338 = 0;
            local_1350 = 0;
            local_b98 = &local_13c8;
            local_f50 = &local_13c8;
            local_13c8 = 0;
            local_13b8 = 0;
            local_13b0 = 0;
            local_13a0 = 0;
            local_139c = 0;
            local_1398 = 0;
            local_1394 = 0;
            local_1390 = 0;
            local_1388 = 0;
            local_13c0 = 0;
            for (local_13cc = 0; local_13cc < local_1024; local_13cc = local_13cc + 1) {
              *(float *)((long)local_1380 + (long)local_13cc * 4) =
                   *(float *)((long)local_1330 + (long)local_13cc * 4) +
                   *(float *)((long)local_1380 + (long)local_13cc * 4);
            }
            local_dd0 = local_1320;
            local_8b0 = local_f50;
            local_890 = local_f60;
            local_4e0 = local_1380;
            local_2b0 = local_1330;
            local_13a8 = local_4f8;
            local_1358 = local_2c8;
          }
        }
      }
      else {
        local_13d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_ff8,1);
        local_b50 = (undefined8 *)(in_RDI + 0xd8);
        local_b58 = 0;
        local_13dc = *(float *)*local_b50;
        local_b60 = (long *)(in_RDI + 0xd8);
        local_b68 = 1;
        local_13e0 = *(float *)(*local_b60 + 4);
        for (local_13e4 = 0; local_13e4 < local_1020; local_13e4 = local_13e4 + 1) {
          local_de8 = &local_1438;
          local_264 = local_1010->w;
          local_268 = local_1010->h;
          local_26c = local_1010->d;
          local_13f0 = (void *)((long)local_1010->data +
                               local_1010->cstep * (long)local_13e4 * local_1010->elemsize);
          local_280 = local_1010->elemsize;
          local_284 = local_1010->elempack;
          local_290 = local_1010->allocator;
          local_260 = &local_1438;
          local_e8 = (long)local_264 * (long)local_268 * local_280;
          local_cf0 = &local_1438;
          local_f40 = &local_1438;
          local_e08 = &local_1488;
          local_22c = local_13d8->w;
          local_230 = local_13d8->h;
          local_234 = local_13d8->d;
          local_1440 = (void *)((long)local_13d8->data +
                               local_13d8->cstep * (long)local_13e4 * local_13d8->elemsize);
          local_248 = local_13d8->elemsize;
          local_24c = local_13d8->elempack;
          local_258 = local_13d8->allocator;
          local_228 = &local_1488;
          local_f8 = (long)local_22c * (long)local_230 * local_248;
          local_cf8 = &local_1488;
          local_f30 = &local_1488;
          local_1400 = 0;
          local_1404 = 0;
          local_1408 = 0;
          local_140c = 0;
          local_1420 = 0;
          local_1428 = 0;
          local_1430 = 0;
          local_1438 = 0;
          local_ec = 0x10;
          local_fc = 0x10;
          local_df0 = local_1010;
          local_df4 = local_13e4;
          local_df5 = 1;
          local_e14 = local_13e4;
          local_e15 = 1;
          local_13f8 = 0;
          local_1410 = 0;
          local_1488 = 0;
          local_1478 = 0;
          local_1470 = 0;
          local_145c = 0;
          local_1458 = 0;
          local_1454 = 0;
          local_1450 = 0;
          local_1480 = 0;
          local_c48 = &local_14d8;
          local_494 = local_1030->w;
          local_498 = local_1030->h;
          local_49c = local_1030->d;
          local_1490 = (void *)((long)local_1030->data +
                               local_1030->cstep * (long)local_13e4 * local_1030->elemsize);
          local_4b0 = local_1030->elemsize;
          local_4b4 = local_1030->elempack;
          local_4c0 = local_1030->allocator;
          local_490 = &local_14d8;
          local_48 = (long)local_494 * (long)local_498 * local_4b0;
          local_4c = 0x10;
          local_c50 = local_1030;
          local_c54 = local_13e4;
          local_c55 = 1;
          local_1448 = 0;
          local_1460 = 0;
          local_ba0 = &local_14d8;
          local_f20 = &local_14d8;
          local_14d8 = 0;
          local_14c8 = 0;
          local_14c0 = 0;
          local_14b0 = 0;
          local_14ac = 0;
          local_14a8 = 0;
          local_14a4 = 0;
          local_14a0 = 0;
          local_1498 = 0;
          local_14d0 = 0;
          for (local_14dc = 0; local_14dc < local_1024; local_14dc = local_14dc + 1) {
            *(float *)((long)local_1490 + (long)local_14dc * 4) =
                 *(float *)((long)local_13f0 + (long)local_14dc * 4) * local_13dc +
                 *(float *)((long)local_1440 + (long)local_14dc * 4) * local_13e0;
          }
          local_e10 = local_13d8;
          local_910 = local_f20;
          local_8f0 = local_f30;
          local_8d0 = local_f40;
          local_4a8 = local_1490;
          local_278 = local_13f0;
          local_240 = local_1440;
          local_14b8 = local_4c0;
          local_1468 = local_258;
          local_1418 = local_290;
        }
        for (local_14e8 = 2; uVar1 = local_14e8,
            sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_ff8),
            uVar1 < sVar2; local_14e8 = local_14e8 + 1) {
          local_14f0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_ff8,local_14e8);
          local_b70 = (long *)(in_RDI + 0xd8);
          local_b78 = local_14e8;
          local_14f4 = *(float *)(*local_b70 + local_14e8 * 4);
          for (local_14f8 = 0; local_14f8 < local_1020; local_14f8 = local_14f8 + 1) {
            local_e28 = &local_1548;
            local_1f4 = local_14f0->w;
            local_1f8 = local_14f0->h;
            local_1fc = local_14f0->d;
            local_1500 = (void *)((long)local_14f0->data +
                                 local_14f0->cstep * (long)local_14f8 * local_14f0->elemsize);
            local_210 = local_14f0->elemsize;
            local_214 = local_14f0->elempack;
            local_220 = local_14f0->allocator;
            local_1f0 = &local_1548;
            local_108 = (long)local_1f4 * (long)local_1f8 * local_210;
            local_d00 = &local_1548;
            local_f10 = &local_1548;
            local_10c = 0x10;
            local_e34 = local_14f8;
            local_e35 = 1;
            local_1548 = 0;
            local_1538 = 0;
            local_1530 = 0;
            local_151c = 0;
            local_1518 = 0;
            local_1514 = 0;
            local_1510 = 0;
            local_1540 = 0;
            local_c68 = &local_1598;
            local_45c = local_1030->w;
            local_460 = local_1030->h;
            local_464 = local_1030->d;
            local_1550 = (void *)((long)local_1030->data +
                                 local_1030->cstep * (long)local_14f8 * local_1030->elemsize);
            local_478 = local_1030->elemsize;
            local_47c = local_1030->elempack;
            local_488 = local_1030->allocator;
            local_458 = &local_1598;
            local_58 = (long)local_45c * (long)local_460 * local_478;
            local_5c = 0x10;
            local_c70 = local_1030;
            local_c74 = local_14f8;
            local_c75 = 1;
            local_1508 = 0;
            local_1520 = 0;
            local_ba8 = &local_1598;
            local_f00 = &local_1598;
            local_1598 = 0;
            local_1588 = 0;
            local_1580 = 0;
            local_1570 = 0;
            local_156c = 0;
            local_1568 = 0;
            local_1564 = 0;
            local_1560 = 0;
            local_1558 = 0;
            local_1590 = 0;
            for (local_159c = 0; local_159c < local_1024; local_159c = local_159c + 1) {
              *(float *)((long)local_1550 + (long)local_159c * 4) =
                   *(float *)((long)local_1500 + (long)local_159c * 4) * local_14f4 +
                   *(float *)((long)local_1550 + (long)local_159c * 4);
            }
            local_e30 = local_14f0;
            local_950 = local_f00;
            local_930 = local_f10;
            local_470 = local_1550;
            local_208 = local_1500;
            local_1578 = local_488;
            local_1528 = local_220;
          }
        }
      }
    }
    else if (*(int *)(in_RDI + 0xd0) == 2) {
      local_15a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_ff8,1);
      for (local_15ac = 0; local_15ac < local_1020; local_15ac = local_15ac + 1) {
        local_e48 = &local_1600;
        local_1bc = local_1010->w;
        local_1c0 = local_1010->h;
        local_1c4 = local_1010->d;
        local_15b8 = (void *)((long)local_1010->data +
                             local_1010->cstep * (long)local_15ac * local_1010->elemsize);
        local_1d8 = local_1010->elemsize;
        local_1dc = local_1010->elempack;
        local_1e8 = local_1010->allocator;
        local_1b8 = &local_1600;
        local_118 = (long)local_1bc * (long)local_1c0 * local_1d8;
        local_d08 = &local_1600;
        local_ef0 = &local_1600;
        local_e68 = &local_1650;
        local_184 = local_15a8->w;
        local_188 = local_15a8->h;
        local_18c = local_15a8->d;
        local_1608 = (void *)((long)local_15a8->data +
                             local_15a8->cstep * (long)local_15ac * local_15a8->elemsize);
        local_1a0 = local_15a8->elemsize;
        local_1a4 = local_15a8->elempack;
        local_1b0 = local_15a8->allocator;
        local_180 = &local_1650;
        local_128 = (long)local_184 * (long)local_188 * local_1a0;
        local_d10 = &local_1650;
        local_ee0 = &local_1650;
        local_c88 = &local_16a0;
        local_424 = local_1030->w;
        local_428 = local_1030->h;
        local_42c = local_1030->d;
        local_1658 = (void *)((long)local_1030->data +
                             local_1030->cstep * (long)local_15ac * local_1030->elemsize);
        local_440 = local_1030->elemsize;
        local_444 = local_1030->elempack;
        local_450 = local_1030->allocator;
        local_420 = &local_16a0;
        local_68 = (long)local_424 * (long)local_428 * local_440;
        local_bb0 = &local_16a0;
        local_ed0 = &local_16a0;
        local_15c8 = 0;
        local_15cc = 0;
        local_15d0 = 0;
        local_15d4 = 0;
        local_15e8 = 0;
        local_15f0 = 0;
        local_15f8 = 0;
        local_1600 = 0;
        local_1618 = 0;
        local_161c = 0;
        local_1620 = 0;
        local_1624 = 0;
        local_1638 = 0;
        local_1640 = 0;
        local_1648 = 0;
        local_1650 = 0;
        local_6c = 0x10;
        local_11c = 0x10;
        local_12c = 0x10;
        local_c90 = local_1030;
        local_c94 = local_15ac;
        local_c95 = 1;
        local_e50 = local_1010;
        local_e54 = local_15ac;
        local_e55 = 1;
        local_e70 = local_15a8;
        local_e74 = local_15ac;
        local_e75 = 1;
        local_15c0 = 0;
        local_15d8 = 0;
        local_1610 = 0;
        local_1628 = 0;
        local_16a0 = 0;
        local_1690 = 0;
        local_1688 = 0;
        local_1678 = 0;
        local_1674 = 0;
        local_1670 = 0;
        local_166c = 0;
        local_1668 = 0;
        local_1660 = 0;
        local_1698 = 0;
        local_9b0 = local_ed0;
        local_990 = local_ee0;
        local_970 = local_ef0;
        local_438 = local_1658;
        local_1d0 = local_15b8;
        local_198 = local_1608;
        local_1680 = local_450;
        local_1630 = local_1b0;
        local_15e0 = local_1e8;
        for (local_16a4 = 0; local_16a4 < local_1024; local_16a4 = local_16a4 + 1) {
          pfVar3 = std::max<float>((float *)((long)local_15b8 + (long)local_16a4 * 4),
                                   (float *)((long)local_1608 + (long)local_16a4 * 4));
          *(float *)((long)local_1658 + (long)local_16a4 * 4) = *pfVar3;
        }
      }
      for (local_16b0 = 2; uVar1 = local_16b0,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_ff8), uVar1 < sVar2
          ; local_16b0 = local_16b0 + 1) {
        local_16b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_ff8,local_16b0);
        for (local_16bc = 0; local_16bc < local_1020; local_16bc = local_16bc + 1) {
          local_e88 = &local_1710;
          local_14c = local_16b8->w;
          local_150 = local_16b8->h;
          local_154 = local_16b8->d;
          local_16c8 = (void *)((long)local_16b8->data +
                               local_16b8->cstep * (long)local_16bc * local_16b8->elemsize);
          local_168 = local_16b8->elemsize;
          local_16c = local_16b8->elempack;
          local_178 = local_16b8->allocator;
          local_148 = &local_1710;
          local_138 = (long)local_14c * (long)local_150 * local_168;
          local_d18 = &local_1710;
          local_ec0 = &local_1710;
          local_e90 = local_16b8;
          local_e94 = local_16bc;
          local_e95 = 1;
          local_1710 = 0;
          local_1700 = 0;
          local_16f8 = 0;
          local_16e8 = 0;
          local_16e4 = 0;
          local_16e0 = 0;
          local_16dc = 0;
          local_16d8 = 0;
          local_16d0 = 0;
          local_1708 = 0;
          local_ca8 = &local_1760;
          local_3ec = local_1030->w;
          local_3f0 = local_1030->h;
          local_3f4 = local_1030->d;
          local_1718 = (void *)((long)local_1030->data +
                               local_1030->cstep * (long)local_16bc * local_1030->elemsize);
          local_408 = local_1030->elemsize;
          local_40c = local_1030->elempack;
          local_418 = local_1030->allocator;
          local_3e8 = &local_1760;
          local_78 = (long)local_3ec * (long)local_3f0 * local_408;
          local_bb8 = &local_1760;
          local_eb0 = &local_1760;
          local_7c = 0x10;
          local_13c = 0x10;
          local_cb0 = local_1030;
          local_cb4 = local_16bc;
          local_cb5 = 1;
          local_1760 = 0;
          local_1750 = 0;
          local_1748 = 0;
          local_1738 = 0;
          local_1734 = 0;
          local_1730 = 0;
          local_172c = 0;
          local_1728 = 0;
          local_1720 = 0;
          local_1758 = 0;
          local_9f0 = local_eb0;
          local_9d0 = local_ec0;
          local_400 = local_1718;
          local_160 = local_16c8;
          local_1740 = local_418;
          local_16f0 = local_178;
          for (local_1764 = 0; local_1764 < local_1024; local_1764 = local_1764 + 1) {
            pfVar3 = std::max<float>((float *)((long)local_1718 + (long)local_1764 * 4),
                                     (float *)((long)local_16c8 + (long)local_1764 * 4));
            *(float *)((long)local_1718 + (long)local_1764 * 4) = *pfVar3;
          }
        }
      }
    }
    local_fe4 = 0;
  }
  return local_fe4;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int size = w * h * d;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}